

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

void __thiscall duckdb::Value::Value(Value *this,Value *other)

{
  int64_t iVar1;
  
  LogicalType::LogicalType(&this->type_,&other->type_);
  this->is_null = other->is_null;
  iVar1 = (other->value_).hugeint.upper;
  (this->value_).bigint = (other->value_).bigint;
  (this->value_).hugeint.upper = iVar1;
  ::std::__shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2> *)&this->value_info_,
             (__shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2> *)&other->value_info_
            );
  return;
}

Assistant:

Value::Value(const Value &other)
    : type_(other.type_), is_null(other.is_null), value_(other.value_), value_info_(other.value_info_) {
}